

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memcache.c
# Opt level: O1

int memcache_bin_create_request(application_protocol *proto,request *req)

{
  void *pvVar1;
  ushort uVar2;
  long *plVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  undefined8 *puVar8;
  long *in_FS_OFFSET;
  double dVar9;
  
  lVar7 = *in_FS_OFFSET;
  in_FS_OFFSET[-0xe] = 0;
  in_FS_OFFSET[-0xd] = 0;
  in_FS_OFFSET[-0xc] = 0;
  in_FS_OFFSET[-0xb] = 0;
  plVar3 = (long *)proto->arg;
  lVar4 = plVar3[2];
  if (*(code **)(lVar4 + 0x14) == (code *)0x0) {
    drand48();
    dVar9 = (double)(**(code **)(lVar4 + 0xc))(lVar4);
  }
  else {
    dVar9 = (double)(**(code **)(lVar4 + 0x14))(lVar4);
  }
  lVar4 = *(long *)(*plVar3 + 0x18);
  *(undefined1 *)(in_FS_OFFSET + -0xe) = 0x80;
  uVar2 = *(ushort *)(lVar4 + 8 + (long)(int)dVar9 * 0x10);
  *(ushort *)((long)in_FS_OFFSET + -0x6e) = uVar2 << 8 | uVar2 >> 8;
  *(undefined1 *)((long)in_FS_OFFSET + -0x6b) = 0;
  *(undefined2 *)((long)in_FS_OFFSET + -0x6a) = 0;
  if (lVar4 == 0) {
    __assert_fail("key != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/memcache.c"
                  ,0xdf,
                  "int memcache_bin_create_request(struct application_protocol *, struct request *)"
                 );
  }
  pvVar1 = (void *)(lVar7 + -0x70);
  puVar8 = (undefined8 *)(lVar4 + (long)(int)dVar9 * 0x10);
  dVar9 = drand48();
  if (dVar9 < (double)plVar3[3] || dVar9 == (double)plVar3[3]) {
    *(undefined1 *)((long)in_FS_OFFSET + -0x6f) = 0xc;
    *(undefined1 *)((long)in_FS_OFFSET + -0x6c) = 0;
    uVar6 = *(uint *)(puVar8 + 1);
    *(uint *)(in_FS_OFFSET + -0xd) =
         uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    req->iovs[0].iov_base = pvVar1;
    req->iovs[0].iov_len = 0x18;
    req->iovs[1].iov_base = (void *)*puVar8;
    lVar4 = puVar8[1];
    iVar5 = 2;
    lVar7 = 0x28;
  }
  else {
    lVar4 = plVar3[1];
    if (*(code **)(lVar4 + 0x14) == (code *)0x0) {
      drand48();
      dVar9 = (double)(**(code **)(lVar4 + 0xc))(lVar4);
    }
    else {
      dVar9 = (double)(**(code **)(lVar4 + 0x14))(lVar4);
    }
    lVar4 = lround(dVar9);
    if (0x200000 < lVar4) {
      __assert_fail("val_len <= MAX_VAL_SIZE",
                    "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/memcache.c"
                    ,0xe4,
                    "int memcache_bin_create_request(struct application_protocol *, struct request *)"
                   );
    }
    *(undefined1 *)((long)in_FS_OFFSET + -0x6f) = 1;
    *(undefined1 *)((long)in_FS_OFFSET + -0x6c) = 8;
    uVar6 = *(int *)(puVar8 + 1) + (int)lVar4 + 8;
    *(uint *)(in_FS_OFFSET + -0xd) =
         uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 * 0x1000000;
    req->iovs[0].iov_base = pvVar1;
    req->iovs[0].iov_len = 0x18;
    req->iovs[1].iov_base = (void *)(lVar7 + -0x58);
    req->iovs[1].iov_len = 8;
    req->iovs[2].iov_base = (void *)*puVar8;
    req->iovs[2].iov_len = puVar8[1];
    req->iovs[3].iov_base = random_char;
    iVar5 = 4;
    lVar7 = 0x48;
  }
  *(long *)((long)&((request *)(req->iovs + -1))->meta + lVar7) = lVar4;
  req->iov_cnt = iVar5;
  return 0;
}

Assistant:

static int memcache_bin_create_request(struct application_protocol *proto,
									   struct request *req)
{
	struct kv_info *info;
	long val_len;
	int key_idx;
	struct iovec *key;

	bzero(&header, sizeof(struct bmc_header));
	extras = 0;

	info = (struct kv_info *)proto->arg;
	key_idx = generate(info->key_sel);
	key = &info->key->keys[key_idx];

	header.magic = 0x80;
	header.key_len = htons(key->iov_len);
	header.data_type = 0x00;
	header.vbucket = 0x00;
	assert(key != NULL);

	if (drand48() > info->get_ratio) {
		// set
		val_len = lround(generate(info->val_len));
		assert(val_len <= MAX_VAL_SIZE);

		header.opcode = CMD_SET;
		header.extra_len = 0x08; // sets have extras for flags and expiration
		header.body_len = htonl(key->iov_len + val_len + header.extra_len);

		req->iovs[0].iov_base = &header;
		req->iovs[0].iov_len = sizeof(struct bmc_header);
		req->iovs[1].iov_base = &extras;
		req->iovs[1].iov_len = sizeof(uint64_t);
		req->iovs[2].iov_base = key->iov_base;
		req->iovs[2].iov_len = key->iov_len;
		req->iovs[3].iov_base = random_char;
		req->iovs[3].iov_len = val_len;

		req->iov_cnt = 4;
	} else {
		// get
		header.opcode = CMD_GETK;
		header.extra_len = 0x00;
		header.body_len = htonl(key->iov_len);

		req->iovs[0].iov_base = &header;
		req->iovs[0].iov_len = sizeof(struct bmc_header);
		req->iovs[1].iov_base = key->iov_base;
		req->iovs[1].iov_len = key->iov_len;

		req->iov_cnt = 2;
	}

	return 0;
}